

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O2

void __thiscall
TPZFrontMatrix<std::complex<long_double>,_TPZFileEqnStorage<std::complex<long_double>_>,_TPZFrontSym<std::complex<long_double>_>_>
::~TPZFrontMatrix(TPZFrontMatrix<std::complex<long_double>,_TPZFileEqnStorage<std::complex<long_double>_>,_TPZFrontSym<std::complex<long_double>_>_>
                  *this,void **vtt)

{
  (this->super_TPZAbstractFrontMatrix<std::complex<long_double>_>).
  super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
       = (_func_int **)*vtt;
  TPZVec<int>::~TPZVec(&this->fNumElConnectedBackup);
  TPZVec<int>::~TPZVec(&this->fNumElConnected);
  TPZFrontSym<std::complex<long_double>_>::~TPZFrontSym(&this->fFront);
  TPZFileEqnStorage<std::complex<long_double>_>::~TPZFileEqnStorage(&this->fStorage);
  return;
}

Assistant:

TPZFrontMatrix<TVar,store, front>::~TPZFrontMatrix(){
}